

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_149ae79::SumSquares1DTest_RandomValues_Test::TestBody
          (SumSquares1DTest_RandomValues_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  Message *lhs;
  char *in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint64_t tst_res;
  uint64_t ref_res;
  int n;
  int i;
  int iter;
  int16_t src [65536];
  int in_stack_fffffffffffdff5c;
  AssertHelper *in_stack_fffffffffffdff60;
  undefined7 in_stack_fffffffffffdff70;
  byte bVar3;
  undefined4 in_stack_fffffffffffdff80;
  undefined4 in_stack_fffffffffffdff84;
  uint uVar4;
  Type in_stack_fffffffffffdff8c;
  AssertHelper *in_stack_fffffffffffdff90;
  AssertionResult aAStack_20068 [2];
  RegisterStateCheckMMX RStack_20046;
  Message *message;
  int iStack_20010;
  int iStack_2000c;
  short asStack_20008 [65540];
  
  iStack_2000c = 0;
  while( true ) {
    bVar3 = 0;
    if (iStack_2000c < 1000) {
      bVar1 = testing::Test::HasFatalFailure();
      bVar3 = bVar1 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) {
      return;
    }
    for (iStack_20010 = 0; iStack_20010 < 0x10000; iStack_20010 = iStack_20010 + 1) {
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)in_stack_fffffffffffdff60,in_stack_fffffffffffdff5c);
      asStack_20008[iStack_20010] = (short)iVar2 + -0xfff;
    }
    iVar2 = libaom_test::ACMRandom::operator()
                      ((ACMRandom *)in_stack_fffffffffffdff60,in_stack_fffffffffffdff5c);
    iVar2 = (iVar2 + 1) * 0x40;
    this_00 = (AssertHelper *)(**(code **)(in_RDI + 0x20))(asStack_20008,iVar2);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&RStack_20046);
    lhs = (Message *)(**(code **)(in_RDI + 0x28))(asStack_20008,iVar2);
    message = lhs;
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xc6dbae);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_RDI,(char *)CONCAT17(bVar3,in_stack_fffffffffffdff70),(unsigned_long *)lhs,
               (unsigned_long *)in_stack_fffffffffffdff60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(aAStack_20068);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffdff90);
      in_stack_fffffffffffdff60 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xc6dc1e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffdff90,in_stack_fffffffffffdff8c,
                 (char *)CONCAT44(in_stack_fffffffffffdff84,in_stack_fffffffffffdff80),
                 (int)((ulong)in_RDI >> 0x20),(char *)CONCAT17(bVar3,in_stack_fffffffffffdff70));
      testing::internal::AssertHelper::operator=(this_00,message);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffdff60);
      testing::Message::~Message((Message *)0xc6dc6c);
    }
    uVar4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc6dccc);
    if (uVar4 != 0) break;
    iStack_2000c = iStack_2000c + 1;
    in_stack_fffffffffffdff84 = 0;
  }
  return;
}

Assistant:

TEST_P(SumSquares1DTest, RandomValues) {
  DECLARE_ALIGNED(16, int16_t, src[kMaxSize * kMaxSize]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    for (int i = 0; i < kMaxSize * kMaxSize; ++i)
      src[i] = rng_(kInt13Max * 2 + 1) - kInt13Max;

    // Block size is between 64 and 128 * 128 and is always a multiple of 64.
    const int n = (rng_(255) + 1) * 64;

    const uint64_t ref_res = params_.ref_func(src, n);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(src, n));

    ASSERT_EQ(ref_res, tst_res);
  }
}